

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<BLOCK_SIZE> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 *in_RSI;
  ParamGenerator<BLOCK_SIZE> PVar2;
  initializer_list<BLOCK_SIZE> __l;
  allocator_type local_2d;
  undefined4 local_2c;
  vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_2c = *in_RSI;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_2c;
  std::vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>::vector(&local_28,__l,&local_2d);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<BLOCK_SIZE_const*,std::vector<BLOCK_SIZE,std::allocator<BLOCK_SIZE>>>>
                    ((testing *)this,
                     (__normal_iterator<const_BLOCK_SIZE_*,_std::vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>_>
                      )local_28.super__Vector_base<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<const_BLOCK_SIZE_*,_std::vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>_>
                      )local_28.super__Vector_base<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_28.super__Vector_base<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>._M_impl.
      super__Vector_impl_data._M_start != (anon_enum_8 *)0x0) {
    operator_delete(local_28.super__Vector_base<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>._M_impl.
                    super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<BLOCK_SIZE>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }